

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall ki::dml::Field<int>::Field(Field<int> *this,string *name)

{
  size_t sVar1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  FieldBase::FieldBase(&this->super_FieldBase,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_FieldBase).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_write_to_0015f0e0;
  sVar1 = std::type_info::hash_code((type_info *)&int::typeinfo);
  (this->super_FieldBase).m_type_hash = sVar1;
  this->m_value = 0;
  return;
}

Assistant:

Field(std::string name) : FieldBase(name)
		{
			m_type_hash = typeid(ValueT).hash_code();
			m_value = ValueT();
		}